

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUnit.h
# Opt level: O1

void __thiscall
QUnit::UnitTest::evaluate
          (UnitTest *this,bool compare,bool result,string *val1,string *val2,string *str1,
          string *str2,char *file,int line,char *func)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  undefined7 in_register_00000011;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  long *local_58;
  long local_50;
  long local_48 [2];
  string *local_38;
  
  sVar3 = val1->_M_string_length;
  if ((int)CONCAT71(in_register_00000011,result) == 0) {
    bVar7 = true;
    if (sVar3 != val2->_M_string_length) goto LAB_00109ca3;
    if (sVar3 != 0) {
      iVar2 = bcmp((val1->_M_dataplus)._M_p,(val2->_M_dataplus)._M_p,sVar3);
      bVar7 = iVar2 != 0;
      goto LAB_00109ca3;
    }
  }
  else if (sVar3 == val2->_M_string_length) {
    if (sVar3 == 0) {
      bVar7 = true;
    }
    else {
      iVar2 = bcmp((val1->_M_dataplus)._M_p,(val2->_M_dataplus)._M_p,sVar3);
      bVar7 = iVar2 == 0;
    }
    goto LAB_00109ca3;
  }
  bVar7 = false;
LAB_00109ca3:
  this->tests_ = this->tests_ + 1;
  this->errors_ = this->errors_ + (uint)(bVar7 ^ 1U);
  if (this->verboseLevel_ != 0 && (this->verboseLevel_ < 3 & bVar7) == 0) {
    poVar4 = this->out_;
    local_38 = val2;
    if (file == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar3 = strlen(file);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,file,sVar3);
    }
    pcVar5 = ":";
    if (bVar7 != false) {
      pcVar5 = ";";
    }
    pcVar6 = "FAILED/";
    if (bVar7 != false) {
      pcVar6 = "OK/";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,line);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
    poVar4 = this->out_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,(ulong)(bVar7 ^ 1U) * 4 + 3);
    if (func == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar3 = strlen(func);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,func,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(): ",4);
    if (compare) {
      pcVar5 = "!=";
      if (result) {
        pcVar5 = "==";
      }
      pcVar6 = "!=";
      if (result) {
        pcVar6 = "==";
      }
      local_58 = local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar5,pcVar6 + 2);
      poVar4 = this->out_;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"compare {",9);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(str1->_M_dataplus)._M_p,str1->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"} ",2);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_58,local_50);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," {",2);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(str2->_M_dataplus)._M_p,str2->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"} ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"got {\"",6);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(val1->_M_dataplus)._M_p,val1->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"} ",3);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_58,local_50);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," {\"",3);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(local_38->_M_dataplus)._M_p,local_38->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"}",2);
      if (local_58 != local_48) {
        operator_delete(local_58,local_48[0] + 1);
      }
    }
    else {
      poVar4 = this->out_;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"evaluate {",10);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(str1->_M_dataplus)._M_p,str1->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"} == ",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,(val1->_M_dataplus)._M_p,val1->_M_string_length);
    }
    cVar1 = (char)this->out_;
    std::ios::widen((char)*(undefined8 *)(*(long *)this->out_ + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
  }
  return;
}

Assistant:

inline void UnitTest::evaluate(
        bool compare, bool result,
        std::string val1, std::string val2,
        std::string str1, std::string str2,
        const char * file, int line, const char * func) {

        bool ok = result ? (val1 == val2) : (val1 != val2);
        tests_ += 1;
        errors_ += ok ? 0 : 1;

        if( (ok && !(verboseLevel_ > normal)) || verboseLevel_ == silent )
            return;

        out_ << file << ( ok ? ";" : ":" ) << line << ": ";
        out_ << ( ok ? "OK/" : "FAILED/" ) << func << "(): ";
        if( compare ) {
            const std::string cmp = ( result ? "==" : "!=" );
            out_ << "compare {" << str1 << "} " << cmp << " {" <<  str2 << "} "
                 << "got {\"" << val1 << "\"} " << cmp << " {\"" << val2 << "\"}";
        } else {
            out_ << "evaluate {" << str1 << "} == " << val1;
        }
        out_ << std::endl;
    }